

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

DtlsConfig * ot::commissioner::GetDtlsConfig(DtlsConfig *__return_storage_ptr__,Config *aConfig)

{
  Config *aConfig_local;
  DtlsConfig *dtlsConfig;
  
  DtlsConfig::DtlsConfig(__return_storage_ptr__);
  __return_storage_ptr__->mEnableDebugLogging = (bool)(aConfig->mEnableDtlsDebugLogging & 1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mPSK,&aConfig->mPSKc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mOwnKey,&aConfig->mPrivateKey);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mOwnCert,&aConfig->mCertificate);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&__return_storage_ptr__->mCaChain,&aConfig->mTrustAnchor);
  return __return_storage_ptr__;
}

Assistant:

DtlsConfig GetDtlsConfig(const Config &aConfig)
{
    DtlsConfig dtlsConfig;

    dtlsConfig.mEnableDebugLogging = aConfig.mEnableDtlsDebugLogging;

    dtlsConfig.mPSK     = aConfig.mPSKc;
    dtlsConfig.mOwnKey  = aConfig.mPrivateKey;
    dtlsConfig.mOwnCert = aConfig.mCertificate;
    dtlsConfig.mCaChain = aConfig.mTrustAnchor;

    return dtlsConfig;
}